

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildFileGenerator.cxx
# Opt level: O3

void __thiscall
cmExportBuildFileGenerator::GetTargets
          (cmExportBuildFileGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *targets)

{
  cmExportSet *pcVar1;
  pointer puVar2;
  cmTargetExport *__x;
  unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_> *te;
  pointer puVar3;
  
  pcVar1 = this->ExportSet;
  if (pcVar1 != (cmExportSet *)0x0) {
    puVar2 = (pcVar1->TargetExports).
             super__Vector_base<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar3 = (pcVar1->TargetExports).
                  super__Vector_base<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar3 != puVar2; puVar3 = puVar3 + 1)
    {
      __x = (puVar3->_M_t).
            super___uniq_ptr_impl<cmTargetExport,_std::default_delete<cmTargetExport>_>._M_t.
            super__Tuple_impl<0UL,_cmTargetExport_*,_std::default_delete<cmTargetExport>_>.
            super__Head_base<0UL,_cmTargetExport_*,_false>._M_head_impl;
      if (__x->NamelinkOnly == false) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(targets,&__x->TargetName);
      }
    }
    return;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(targets,&this->Targets);
  return;
}

Assistant:

void cmExportBuildFileGenerator::GetTargets(
  std::vector<std::string>& targets) const
{
  if (this->ExportSet) {
    for (std::unique_ptr<cmTargetExport> const& te :
         this->ExportSet->GetTargetExports()) {
      if (te->NamelinkOnly) {
        continue;
      }
      targets.push_back(te->TargetName);
    }
    return;
  }
  targets = this->Targets;
}